

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ch.cpp
# Opt level: O1

HRESULT CreateParserState(LPCSTR fileContents,size_t fileLength,
                         JsFinalizeCallback fileContentsFinalizeCallback,LPCWSTR fullPath)

{
  char *_Dst;
  bool bVar1;
  JsErrorCode JVar2;
  int iVar3;
  BOOL BVar4;
  HRESULT HVar5;
  PAL_FILE *pPVar6;
  LPCWSTR pWVar7;
  HANDLE hFile;
  JsFinalizeCallback fileContentsFinalizeCallback_00;
  size_t extraout_RDX;
  undefined8 uVar8;
  LPCSTR fileContents_00;
  char16_t *format;
  char *fileName;
  char *pcVar9;
  uint *puVar10;
  ulong uVar11;
  JsValueRef pvStack_b8;
  size_t sStack_b0;
  char *pcStack_a8;
  JsRuntimeHandle pvStack_a0;
  JsContextRef pvStack_98;
  JsContextRef pvStack_90;
  undefined8 uStack_88;
  char *pcStack_80;
  uint *puStack_78;
  HANDLE pVStack_70;
  ulong uStack_68;
  code *pcStack_60;
  JsValueRef local_50;
  JsValueRef parserStateBuffer;
  BYTE *buffer;
  DWORD local_38;
  uint uStack_34;
  char scratch [3];
  DWORD written;
  uint bufferSize;
  
  uVar8 = 0;
  local_50 = (JsValueRef)0x0;
  parserStateBuffer = (JsValueRef)0x0;
  puVar10 = &stack0xffffffffffffffcc;
  uStack_34 = 0;
  pcStack_60 = (code *)0x108dd3;
  GetParserStateBuffer(fileContents,fileContentsFinalizeCallback,&local_50);
  pcStack_60 = (code *)0x108de9;
  JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetArrayBufferStorage)
                    (local_50,(BYTE **)&parserStateBuffer,puVar10);
  if (JVar2 == JsNoError) {
    pcStack_60 = (code *)0x108e35;
    hFile = GetFileHandle(fullPath);
    if ((long)hFile + 1U < 2) {
      uVar8 = 0x80004005;
    }
    else if (uStack_34 != 0) {
      _Dst = (char *)((long)&buffer + 5);
      uVar11 = 0;
      uVar8 = 0;
      do {
        local_38 = 0;
        pcVar9 = (char *)(ulong)*(byte *)((long)parserStateBuffer + uVar11);
        fileContents_00 = (LPCSTR)0x3;
        fileContentsFinalizeCallback_00 = (JsFinalizeCallback)0x157b8b;
        pcStack_60 = (code *)0x108e9e;
        fileName = _Dst;
        iVar3 = _snprintf_unsafe(_Dst,3,3,"%02X");
        if (iVar3 != 2) {
          pcStack_60 = CreateParserStateAndRunScript;
          CreateParserState();
          pvStack_a0 = (JsRuntimeHandle)0x0;
          pvStack_98 = (JsContextRef)0x0;
          pvStack_90 = (JsContextRef)0x0;
          sStack_b0 = extraout_RDX;
          uStack_88 = uVar8;
          pcStack_80 = _Dst;
          puStack_78 = puVar10;
          pVStack_70 = hFile;
          uStack_68 = uVar11;
          pcStack_60 = (code *)&stack0xfffffffffffffff8;
          GetParserStateBuffer(fileContents_00,(JsFinalizeCallback)0x0,&pvStack_b8);
          HVar5 = CreateRuntime(&pvStack_a0);
          if (-1 < HVar5) {
            chRuntime = pvStack_a0;
            pcStack_a8 = pcVar9;
            JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateContext)(pvStack_a0,&pvStack_98);
            if (JVar2 == JsNoError) {
              JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetCurrentContext)(&pvStack_90);
              if (JVar2 == JsNoError) {
                JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)(pvStack_98);
                if (JVar2 == JsNoError) {
                  HVar5 = -0x7fffbffb;
                  bVar1 = WScriptJsrt::Initialize();
                  if (bVar1) {
                    HVar5 = RunScript(fileName,fileContents_00,sStack_b0,
                                      fileContentsFinalizeCallback_00,(JsValueRef)0x0,pcStack_a8,
                                      pvStack_b8);
                    goto LAB_00109038;
                  }
                  goto LAB_0010902e;
                }
                pPVar6 = PAL_get_stderr(0);
                pWVar7 = Helpers::JsErrorCodeToString(JVar2);
                format = 
                L"ERROR: ChakraRTInterface::JsSetCurrentContext(context) failed. JsErrorCode=0x%x (%s)\n"
                ;
              }
              else {
                pPVar6 = PAL_get_stderr(0);
                pWVar7 = Helpers::JsErrorCodeToString(JVar2);
                format = 
                L"ERROR: ChakraRTInterface::JsGetCurrentContext(&current) failed. JsErrorCode=0x%x (%s)\n"
                ;
              }
            }
            else {
              pPVar6 = PAL_get_stderr(0);
              pWVar7 = Helpers::JsErrorCodeToString(JVar2);
              format = 
              L"ERROR: ChakraRTInterface::JsCreateContext(runtime, &context) failed. JsErrorCode=0x%x (%s)\n"
              ;
            }
            PAL_fwprintf(pPVar6,format,(ulong)JVar2,pWVar7);
            HVar5 = 0;
            pPVar6 = PAL_get_stderr(0);
            PAL_fflush(pPVar6);
          }
LAB_0010902e:
          if (fileContentsFinalizeCallback_00 != (JsFinalizeCallback)0x0) {
            (*fileContentsFinalizeCallback_00)(fileContents_00);
          }
LAB_00109038:
          if (pvStack_90 != (JsContextRef)0x0) {
            (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)(pvStack_90);
          }
          if (pvStack_a0 != (JsRuntimeHandle)0x0) {
            (*ChakraRTInterface::m_jsApiHooks.pfJsrtDisposeRuntime)(pvStack_a0);
          }
          return HVar5;
        }
        pcStack_60 = (code *)0x108ebd;
        BVar4 = WriteFile(hFile,_Dst,2,&local_38,(LPOVERLAPPED)0x0);
        if (BVar4 == 0) {
LAB_00108efb:
          puVar10 = (uint *)0x0;
          uVar8 = 0x80004005;
        }
        else {
          if (((~(uint)uVar11 & 0x1f) == 0) && (uVar11 < uStack_34 - 1)) {
            pcStack_60 = (code *)0x108ef2;
            BVar4 = WriteFile(hFile,"\n",1,&local_38,(LPOVERLAPPED)0x0);
            if (BVar4 == 0) goto LAB_00108efb;
          }
          puVar10 = (uint *)0x1;
        }
      } while (((char)puVar10 != '\0') && (uVar11 = uVar11 + 1, uVar11 < uStack_34));
    }
  }
  else {
    pcStack_60 = (code *)0x108df7;
    pPVar6 = PAL_get_stderr(0);
    pcStack_60 = (code *)0x108e02;
    pWVar7 = Helpers::JsErrorCodeToString(JVar2);
    pcStack_60 = (code *)0x108e19;
    PAL_fwprintf(pPVar6,
                 L"ERROR: ChakraRTInterface::JsGetArrayBufferStorage(parserStateBuffer, &buffer, &bufferSize) failed. JsErrorCode=0x%x (%s)\n"
                 ,(ulong)JVar2,pWVar7);
    pcStack_60 = (code *)0x108e20;
    pPVar6 = PAL_get_stderr(0);
    pcStack_60 = (code *)0x108e28;
    PAL_fflush(pPVar6);
    hFile = (HANDLE)0x0;
  }
  if (hFile != (HANDLE)0x0) {
    pcStack_60 = (code *)0x108e53;
    CloseHandle(hFile);
  }
  return (HRESULT)uVar8;
}

Assistant:

HRESULT CreateParserState(LPCSTR fileContents, size_t fileLength, JsFinalizeCallback fileContentsFinalizeCallback, LPCWSTR fullPath)
{
    HRESULT hr = S_OK;
    HANDLE fileHandle = nullptr;
    JsValueRef parserStateBuffer = nullptr;
    BYTE *buffer = nullptr;
    unsigned int bufferSize = 0;

    IfFailedGoLabel(GetParserStateBuffer(fileContents, fileContentsFinalizeCallback, &parserStateBuffer), Error);
    IfJsErrorFailLog(ChakraRTInterface::JsGetArrayBufferStorage(parserStateBuffer, &buffer, &bufferSize));

    fileHandle = GetFileHandle(fullPath);
    IfFalseGo(fileHandle != INVALID_HANDLE_VALUE && fileHandle != nullptr);

    for (unsigned int i = 0; i < bufferSize; i++)
    {
        const unsigned int BYTES_PER_LINE = 32;
        DWORD written = 0;
        char scratch[3];
        auto scratchLen = sizeof(scratch);
        int num = _snprintf_s(scratch, scratchLen, _countof(scratch), "%02X", buffer[i]);
        Assert(num == 2);
        IfFalseGo(WriteFile(fileHandle, scratch, (DWORD)(scratchLen - 1), &written, nullptr));

        // Add line breaks so this block can be readable
        if (i % BYTES_PER_LINE == (BYTES_PER_LINE - 1) && i < bufferSize - 1)
        {
            IfFalseGo(WriteFile(fileHandle, "\n", 1, &written, nullptr));
        }
    }

Error:
    if (fileHandle != nullptr)
    {
        CloseHandle(fileHandle);
    }
    return hr;
}